

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O3

char * icetSingleImageStrategyNameFromEnum(IceTEnum strategy)

{
  if (strategy - 0x7001 < 4) {
    return &DAT_0011ef34 + *(int *)(&DAT_0011ef34 + (ulong)(strategy - 0x7001) * 4);
  }
  icetRaiseDiagnostic("Invalid single image strategy.",0xfffffffe,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/strategies/select.c"
                      ,0x95);
  return "<Invalid>";
}

Assistant:

const char *icetSingleImageStrategyNameFromEnum(IceTEnum strategy)
{
    switch(strategy) {
      case ICET_SINGLE_IMAGE_STRATEGY_AUTOMATIC:        return "Automatic";
      case ICET_SINGLE_IMAGE_STRATEGY_BSWAP:            return "Binary Swap";
      case ICET_SINGLE_IMAGE_STRATEGY_TREE:             return "Binary Tree";
      case ICET_SINGLE_IMAGE_STRATEGY_RADIXK:           return "Radix-k";
      default:
          icetRaiseError("Invalid single image strategy.", ICET_INVALID_ENUM);
          return "<Invalid>";
    }
}